

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O0

int list_insert(List *list,uint index,void *data)

{
  ListNode *pLVar1;
  ListNode *pLVar2;
  ListNode *node;
  ListNode *new;
  void *data_local;
  uint index_local;
  List *list_local;
  
  pLVar1 = new_node(data);
  if ((index == 0) || (index == 1)) {
    if (list->head == (ListNode *)0x0) {
      list->head = pLVar1;
    }
    else if (list->tail == (ListNode *)0x0) {
      list->tail = pLVar1;
      pLVar1->prev = list->head;
      list->head->next = pLVar1;
    }
    else {
      list->head->prev = pLVar1;
      pLVar1->next = list->head;
      list->head = pLVar1;
    }
  }
  else {
    pLVar2 = list_get_(list,index);
    if (pLVar2 == (ListNode *)0x0) {
      if (list->size != index) {
        return -1;
      }
      pLVar1->prev = list->tail;
      list->tail->next = pLVar1;
      list->tail = pLVar1;
    }
    else {
      pLVar1->next = pLVar2;
      pLVar1->prev = pLVar2->prev;
      pLVar2->prev->next = pLVar1;
      pLVar2->prev = pLVar1;
    }
  }
  list->size = list->size + 1;
  return 1;
}

Assistant:

int list_insert(List * list, unsigned int index, void *data){
    ListNode* new = new_node(data);
    // 第一个位置插入
    if (index == 0 || index == 1){
        if (list->head == NULL){
            /**
            * 如果头为空,说明没有添加任何数据,所以直接插入
            */
            list->head = new;
        }else if (list->tail == NULL){
            /**
             * 如果尾部也是空,说明这是第二次添加, 所以直接插入到尾
             */
            list->tail = new;
            new->prev = list->head;
            list->head->next = new;
        }else{
            /**
             * 直接在第一个位置插入
             */
            list->head->prev = new;
            new->next = list->head;
            list->head = new;
        }
    }else{
        ListNode* node = list_get_(list, index);
        if (node != NULL){
            /**
             * 直接插入到指定位置
             */
            new->next = node;
            new->prev = node->prev;
            node->prev->next = new;
            node->prev = new;
        }else if(node == NULL && list->size == index){
            /**
             * node等于空且 list->size == index 说明需要更新尾部
             */
            new->prev = list->tail;
            list->tail->next = new;
            list->tail = new;
        }else{
            /**
             * 越界
             */
            return -1;
        }
    }
    /**
     * 维护 size
     */
    list->size++;
    return 1;
}